

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O2

yyjson_mut_val *
duckdb_yyjson::unsafe_yyjson_mut_val_mut_copy(yyjson_mut_doc *m_doc,yyjson_mut_val *m_vals)

{
  yyjson_val_pool *pool;
  yyjson_str_pool *pool_00;
  void *__src;
  yyjson_mut_val *m_vals_00;
  bool bVar1;
  uint uVar2;
  yyjson_mut_val *pyVar3;
  yyjson_mut_val *pyVar4;
  yyjson_mut_val *pyVar5;
  char *__dest;
  yyjson_mut_val *m_vals_01;
  ulong uVar6;
  
  pool = &m_doc->val_pool;
  pyVar5 = (m_doc->val_pool).cur;
  if ((m_doc->val_pool).end == pyVar5) {
    bVar1 = unsafe_yyjson_val_pool_grow(pool,&m_doc->alc,1);
    if (!bVar1) {
      return (yyjson_mut_val *)0x0;
    }
    pyVar5 = pool->cur;
  }
  pool->cur = pyVar5 + 1;
  if (pyVar5 == (yyjson_mut_val *)0x0) {
    return (yyjson_mut_val *)0x0;
  }
  uVar6 = m_vals->tag;
  pyVar5->tag = uVar6;
  uVar2 = (uint)uVar6 & 7;
  if (uVar2 - 6 < 2) {
    if (uVar6 < 0x100) {
      return pyVar5;
    }
    m_vals_00 = (yyjson_mut_val *)(m_vals->uni).str;
    m_vals_01 = m_vals_00->next;
    pyVar3 = unsafe_yyjson_mut_val_mut_copy(m_doc,m_vals_00);
    if (pyVar3 == (yyjson_mut_val *)0x0) {
      return (yyjson_mut_val *)0x0;
    }
    (pyVar5->uni).str = (char *)pyVar3;
    while( true ) {
      if (m_vals_01 == m_vals_00) {
        pyVar3->next = (yyjson_mut_val *)pyVar5->uni;
        return pyVar5;
      }
      pyVar4 = unsafe_yyjson_mut_val_mut_copy(m_doc,m_vals_01);
      pyVar3->next = pyVar4;
      if (pyVar4 == (yyjson_mut_val *)0x0) break;
      m_vals_01 = m_vals_01->next;
      pyVar3 = pyVar4;
    }
    return (yyjson_mut_val *)0x0;
  }
  if ((uVar2 != 1) && (uVar2 != 5)) {
    pyVar5->uni = m_vals->uni;
    return pyVar5;
  }
  __src = (m_vals->uni).ptr;
  uVar6 = uVar6 >> 8;
  pool_00 = &m_doc->str_pool;
  __dest = (m_doc->str_pool).cur;
  if ((ulong)((long)(m_doc->str_pool).end - (long)__dest) <= uVar6) {
    bVar1 = unsafe_yyjson_str_pool_grow(pool_00,&m_doc->alc,uVar6 + 1);
    if (!bVar1) goto LAB_00f09d95;
    __dest = pool_00->cur;
  }
  pool_00->cur = __dest + uVar6 + 1;
  if (__dest != (char *)0x0) {
    switchD_00916250::default(__dest,__src,uVar6);
    __dest[uVar6] = '\0';
    (pyVar5->uni).ptr = __dest;
    return pyVar5;
  }
LAB_00f09d95:
  (pyVar5->uni).u64 = 0;
  return (yyjson_mut_val *)0x0;
}

Assistant:

static yyjson_mut_val *unsafe_yyjson_mut_val_mut_copy(yyjson_mut_doc *m_doc,
                                                      yyjson_mut_val *m_vals) {
    /*
     The mutable object or array stores all sub-values in a circular linked
     list, so we can traverse them in the same loop. The traversal starts from
     the last item, continues with the first item in a list, and ends with the
     second to last item, which needs to be linked to the last item to close the
     circle.
     */
    yyjson_mut_val *m_val = unsafe_yyjson_mut_val(m_doc, 1);
    if (unlikely(!m_val)) return NULL;
    m_val->tag = m_vals->tag;

    switch (unsafe_yyjson_get_type(m_vals)) {
        case YYJSON_TYPE_OBJ:
        case YYJSON_TYPE_ARR:
            if (unsafe_yyjson_get_len(m_vals) > 0) {
                yyjson_mut_val *last = (yyjson_mut_val *)m_vals->uni.ptr;
                yyjson_mut_val *next = last->next, *prev;
                prev = unsafe_yyjson_mut_val_mut_copy(m_doc, last);
                if (!prev) return NULL;
                m_val->uni.ptr = (void *)prev;
                while (next != last) {
                    prev->next = unsafe_yyjson_mut_val_mut_copy(m_doc, next);
                    if (!prev->next) return NULL;
                    prev = prev->next;
                    next = next->next;
                }
                prev->next = (yyjson_mut_val *)m_val->uni.ptr;
            }
            break;

        case YYJSON_TYPE_RAW:
        case YYJSON_TYPE_STR: {
            const char *str = m_vals->uni.str;
            usize str_len = unsafe_yyjson_get_len(m_vals);
            m_val->uni.str = unsafe_yyjson_mut_strncpy(m_doc, str, str_len);
            if (!m_val->uni.str) return NULL;
            break;
        }

        default:
            m_val->uni = m_vals->uni;
            break;
    }

    return m_val;
}